

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

State * __thiscall re2::DFA::WorkqToCachedState(DFA *this,Workq *q,uint flag)

{
  Inst *this_00;
  int iVar1;
  Prog *pPVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  int *inst;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  uint uVar9;
  uint ninst;
  State *pSVar10;
  int *piVar11;
  int *piVar12;
  bool bVar13;
  bool bVar14;
  uint local_50;
  
  lVar7 = (long)q->maxmark_ + (long)q->n_;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (int)lVar7) {
    uVar6 = lVar7 * 4;
  }
  inst = (int *)operator_new__(uVar6);
  if ((q->super_SparseSet).size_ == 0) {
    local_50 = 0;
    bVar14 = true;
    ninst = 0;
  }
  else {
    piVar8 = (q->super_SparseSet).dense_;
    ninst = 0;
    local_50 = 0;
    bVar14 = false;
    bVar13 = false;
    piVar12 = piVar8;
    do {
      iVar1 = *piVar12;
      if ((!bVar13) || ((uVar5 = 2, this->kind_ != kFirstMatch && (iVar1 < q->n_)))) {
        if (iVar1 < q->n_) {
          this_00 = this->prog_->inst_ + iVar1;
          if ((((this_00->out_opcode_ & 7) == 1) && (this->kind_ != kManyMatch)) &&
             ((this->kind_ != kFirstMatch ||
              ((piVar12 == piVar8 && (bVar4 = Prog::Inst::greedy(this_00,this->prog_), bVar4)))))) {
            if (this->kind_ == kLongestMatch) {
              if ((flag >> 0xc & 1) != 0 && !bVar14) {
LAB_00122912:
                operator_delete__(inst);
                uVar5 = 1;
                goto LAB_001229a6;
              }
            }
            else if ((flag >> 0xc & 1) != 0) goto LAB_00122912;
          }
          pPVar2 = this->prog_;
          if ((pPVar2->inst_[(long)iVar1 + -1].out_opcode_ & 8) != 0) {
            lVar7 = (long)(int)ninst;
            ninst = ninst + 1;
            inst[lVar7] = *piVar12;
          }
          uVar9 = this_00->out_opcode_ & 7;
          if (uVar9 == 4) {
            local_50 = local_50 | (this_00->field_1).out1_;
          }
          uVar5 = 0;
          if ((uVar9 == 5) && (pPVar2->anchor_end_ == false)) {
            bVar13 = true;
          }
        }
        else {
          uVar5 = 4;
          if ((0 < (int)ninst) && (inst[(ulong)ninst - 1] != -1)) {
            inst[ninst] = -1;
            bVar14 = true;
            ninst = ninst + 1;
          }
        }
      }
LAB_001229a6:
      if ((uVar5 & 3) != 0) goto LAB_001229c9;
      piVar12 = piVar12 + 1;
      piVar8 = (q->super_SparseSet).dense_;
    } while (piVar12 != piVar8 + (q->super_SparseSet).size_);
    uVar5 = 2;
LAB_001229c9:
    bVar14 = uVar5 == 2;
  }
  pSVar10 = (State *)0x2;
  if (bVar14) {
    if (q->maxmark_ + q->n_ < (int)ninst) {
      __assert_fail("(n) <= (q->size())",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                    0x295,"DFA::State *re2::DFA::WorkqToCachedState(Workq *, uint)");
    }
    if (0 < (int)ninst) {
      ninst = ninst - (inst[(ulong)ninst - 1] == -1);
    }
    uVar5 = flag & 0x1000;
    if (local_50 != 0) {
      uVar5 = flag;
    }
    if (ninst == 0 && uVar5 == 0) {
      pSVar10 = (State *)0x1;
    }
    else {
      if ((this->kind_ == kLongestMatch) && (0 < (int)ninst)) {
        piVar8 = inst + (int)ninst;
        piVar12 = inst;
        do {
          piVar11 = piVar12;
          if (*piVar12 == -1) {
            lVar7 = 4;
          }
          else {
            do {
              piVar11 = piVar11 + 1;
              if (piVar8 <= piVar11) {
                lVar7 = 0;
                goto LAB_00122a89;
              }
            } while (*piVar11 != -1);
            lVar7 = (ulong)(piVar11 < piVar8) << 2;
          }
LAB_00122a89:
          if (piVar12 != piVar11) {
            uVar6 = (long)piVar11 - (long)piVar12 >> 2;
            lVar3 = 0x3f;
            if (uVar6 != 0) {
              for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
              }
            }
            std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (piVar12,piVar11,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
            std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(piVar12,piVar11);
          }
          piVar12 = (int *)((long)piVar11 + lVar7);
        } while (piVar12 < piVar8);
      }
      pSVar10 = CachedState(this,inst,ninst,uVar5 | local_50 << 0x10);
    }
    operator_delete__(inst);
  }
  return pSVar10;
}

Assistant:

DFA::State* DFA::WorkqToCachedState(Workq* q, uint flag) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();

  // Construct array of instruction ids for the new state.
  // Only ByteRange, EmptyWidth, and Match instructions are useful to keep:
  // those are the only operators with any effect in
  // RunWorkqOnEmptyString or RunWorkqOnByte.
  int* inst = new int[q->size()];
  int n = 0;
  uint needflags = 0;     // flags needed by kInstEmptyWidth instructions
  bool sawmatch = false;  // whether queue contains guaranteed kInstMatch
  bool sawmark = false;  // whether queue contains a Mark
  if (DebugDFA)
    fprintf(stderr, "WorkqToCachedState %s [%#x]", DumpWorkq(q).c_str(), flag);
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    int id = *it;
    if (sawmatch && (kind_ == Prog::kFirstMatch || q->is_mark(id)))
      break;
    if (q->is_mark(id)) {
      if (n > 0 && inst[n-1] != Mark) {
        sawmark = true;
        inst[n++] = Mark;
      }
      continue;
    }
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      case kInstAltMatch:
        // This state will continue to a match no matter what
        // the rest of the input is.  If it is the highest priority match
        // being considered, return the special FullMatchState
        // to indicate that it's all matches from here out.
        if (kind_ != Prog::kManyMatch &&
            (kind_ != Prog::kFirstMatch ||
             (it == q->begin() && ip->greedy(prog_))) &&
            (kind_ != Prog::kLongestMatch || !sawmark) &&
            (flag & kFlagMatch)) {
          delete[] inst;
          if (DebugDFA)
            fprintf(stderr, " -> FullMatchState\n");
          return FullMatchState;
        }
        // Fall through.
      default:
        // Record iff id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        if (prog_->inst(id-1)->last())
          inst[n++] = *it;
        if (ip->opcode() == kInstEmptyWidth)
          needflags |= ip->empty();
        if (ip->opcode() == kInstMatch && !prog_->anchor_end())
          sawmatch = true;
        break;
    }
  }
  DCHECK_LE(n, q->size());
  if (n > 0 && inst[n-1] == Mark)
    n--;

  // If there are no empty-width instructions waiting to execute,
  // then the extra flag bits will not be used, so there is no
  // point in saving them.  (Discarding them reduces the number
  // of distinct states.)
  if (needflags == 0)
    flag &= kFlagMatch;

  // NOTE(rsc): The code above cannot do flag &= needflags,
  // because if the right flags were present to pass the current
  // kInstEmptyWidth instructions, new kInstEmptyWidth instructions
  // might be reached that in turn need different flags.
  // The only sure thing is that if there are no kInstEmptyWidth
  // instructions at all, no flags will be needed.
  // We could do the extra work to figure out the full set of
  // possibly needed flags by exploring past the kInstEmptyWidth
  // instructions, but the check above -- are any flags needed
  // at all? -- handles the most common case.  More fine-grained
  // analysis can only be justified by measurements showing that
  // too many redundant states are being allocated.

  // If there are no Insts in the list, it's a dead state,
  // which is useful to signal with a special pointer so that
  // the execution loop can stop early.  This is only okay
  // if the state is *not* a matching state.
  if (n == 0 && flag == 0) {
    delete[] inst;
    if (DebugDFA)
      fprintf(stderr, " -> DeadState\n");
    return DeadState;
  }

  // If we're in longest match mode, the state is a sequence of
  // unordered state sets separated by Marks.  Sort each set
  // to canonicalize, to reduce the number of distinct sets stored.
  if (kind_ == Prog::kLongestMatch) {
    int* ip = inst;
    int* ep = ip + n;
    while (ip < ep) {
      int* markp = ip;
      while (markp < ep && *markp != Mark)
        markp++;
      sort(ip, markp);
      if (markp < ep)
        markp++;
      ip = markp;
    }
  }

  // Save the needed empty-width flags in the top bits for use later.
  flag |= needflags << kFlagNeedShift;

  State* state = CachedState(inst, n, flag);
  delete[] inst;
  return state;
}